

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

CURLcode ossl_connect_step2(connectdata *conn,int sockindex)

{
  Curl_easy *data_00;
  ssl_config_data *psVar1;
  int iVar2;
  ulong errcode;
  char *pcVar3;
  SSL_CIPHER *c;
  char *pcVar4;
  uchar *local_1b0;
  char *local_1a8;
  long *local_198;
  uint local_18c;
  long *plStack_188;
  uint len;
  uchar *neg_protocol;
  long port;
  char *hostname;
  int reason;
  int lib;
  long lerr;
  char local_158 [4];
  CURLcode result;
  char error_buffer [256];
  unsigned_long errdetail;
  int detail;
  long *certverifyresult;
  ssl_connect_data *connssl;
  int err;
  Curl_easy *data;
  int sockindex_local;
  connectdata *conn_local;
  
  data_00 = conn->data;
  if (((conn->http_proxy).proxytype == CURLPROXY_HTTPS) &&
     (conn->proxy_ssl[(int)(uint)(conn->sock[1] != -1)].state != ssl_connection_complete)) {
    psVar1 = &(data_00->set).proxy_ssl;
  }
  else {
    psVar1 = &(data_00->set).ssl;
  }
  local_198 = &psVar1->certverifyresult;
  ERR_clear_error();
  iVar2 = SSL_connect((SSL *)(conn->ssl[sockindex].backend)->handle);
  if (iVar2 == 1) {
    conn->ssl[sockindex].connecting_state = ssl_connect_3;
    pcVar3 = get_ssl_version_txt((conn->ssl[sockindex].backend)->handle);
    c = SSL_get_current_cipher((SSL *)(conn->ssl[sockindex].backend)->handle);
    pcVar4 = SSL_CIPHER_get_name(c);
    Curl_infof(data_00,"SSL connection using %s / %s\n",pcVar3,pcVar4);
    if (((conn->bits).tls_enable_alpn & 1U) != 0) {
      SSL_get0_alpn_selected
                ((conn->ssl[sockindex].backend)->handle,&stack0xfffffffffffffe78,&local_18c);
      if (local_18c == 0) {
        Curl_infof(data_00,"ALPN, server did not agree to a protocol\n");
      }
      else {
        Curl_infof(data_00,"ALPN, server accepted to use %.*s\n",(ulong)local_18c,plStack_188);
        if ((local_18c == 8) && (*plStack_188 == 0x312e312f70747468)) {
          conn->negnpn = 2;
        }
      }
    }
    conn_local._4_4_ = CURLE_OK;
  }
  else {
    iVar2 = SSL_get_error((SSL *)(conn->ssl[sockindex].backend)->handle,iVar2);
    if (iVar2 == 2) {
      conn->ssl[sockindex].connecting_state = ssl_connect_2_reading;
      conn_local._4_4_ = CURLE_OK;
    }
    else if (iVar2 == 3) {
      conn->ssl[sockindex].connecting_state = ssl_connect_2_writing;
      conn_local._4_4_ = CURLE_OK;
    }
    else {
      memset(local_158,0,0x100);
      conn->ssl[sockindex].connecting_state = ssl_connect_2;
      errcode = ERR_get_error();
      hostname._4_4_ = ERR_GET_LIB(errcode);
      hostname._0_4_ = ERR_GET_REASON(errcode);
      if ((hostname._4_4_ == 0x14) && ((int)hostname == 0x86)) {
        lerr._4_4_ = CURLE_SSL_CACERT;
        _reason = SSL_get_verify_result((SSL *)(conn->ssl[sockindex].backend)->handle);
        if (_reason == 0) {
          strcpy(local_158,"SSL certificate verification failed");
        }
        else {
          *local_198 = _reason;
          pcVar3 = X509_verify_cert_error_string(_reason);
          curl_msnprintf(local_158,0x100,"SSL certificate problem: %s",pcVar3);
        }
      }
      else {
        lerr._4_4_ = CURLE_SSL_CONNECT_ERROR;
        ossl_strerror(errcode,local_158,0x100);
      }
      if ((lerr._4_4_ == CURLE_SSL_CONNECT_ERROR) && (errcode == 0)) {
        if (((conn->http_proxy).proxytype == CURLPROXY_HTTPS) &&
           (conn->proxy_ssl[(int)(uint)(conn->sock[1] != -1)].state != ssl_connection_complete)) {
          local_1a8 = (conn->http_proxy).host.name;
        }
        else {
          local_1a8 = (conn->host).name;
        }
        port = (long)local_1a8;
        if (((conn->http_proxy).proxytype == CURLPROXY_HTTPS) &&
           (conn->proxy_ssl[(int)(uint)(conn->sock[1] != -1)].state != ssl_connection_complete)) {
          local_1b0 = (uchar *)conn->port;
        }
        else {
          local_1b0 = (uchar *)(long)conn->remote_port;
        }
        neg_protocol = local_1b0;
        pcVar3 = SSL_ERROR_to_str(iVar2);
        Curl_failf(data_00,"OpenSSL SSL_connect: %s in connection to %s:%ld ",pcVar3,port,
                   neg_protocol);
        conn_local._4_4_ = lerr._4_4_;
      }
      else {
        Curl_failf(data_00,"%s",local_158);
        conn_local._4_4_ = lerr._4_4_;
      }
    }
  }
  return conn_local._4_4_;
}

Assistant:

static CURLcode ossl_connect_step2(struct connectdata *conn, int sockindex)
{
  struct Curl_easy *data = conn->data;
  int err;
  struct ssl_connect_data *connssl = &conn->ssl[sockindex];
  long * const certverifyresult = SSL_IS_PROXY() ?
    &data->set.proxy_ssl.certverifyresult : &data->set.ssl.certverifyresult;
  DEBUGASSERT(ssl_connect_2 == connssl->connecting_state
              || ssl_connect_2_reading == connssl->connecting_state
              || ssl_connect_2_writing == connssl->connecting_state);

  ERR_clear_error();

  err = SSL_connect(BACKEND->handle);
  /* If keylogging is enabled but the keylog callback is not supported then log
     secrets here, immediately after SSL_connect by using tap_ssl_key. */
#if defined(ENABLE_SSLKEYLOGFILE) && !defined(HAVE_KEYLOG_CALLBACK)
  tap_ssl_key(BACKEND->handle, &BACKEND->tap_state);
#endif

  /* 1  is fine
     0  is "not successful but was shut down controlled"
     <0 is "handshake was not successful, because a fatal error occurred" */
  if(1 != err) {
    int detail = SSL_get_error(BACKEND->handle, err);

    if(SSL_ERROR_WANT_READ == detail) {
      connssl->connecting_state = ssl_connect_2_reading;
      return CURLE_OK;
    }
    if(SSL_ERROR_WANT_WRITE == detail) {
      connssl->connecting_state = ssl_connect_2_writing;
      return CURLE_OK;
    }
    else {
      /* untreated error */
      unsigned long errdetail;
      char error_buffer[256]="";
      CURLcode result;
      long lerr;
      int lib;
      int reason;

      /* the connection failed, we're not waiting for anything else. */
      connssl->connecting_state = ssl_connect_2;

      /* Get the earliest error code from the thread's error queue and removes
         the entry. */
      errdetail = ERR_get_error();

      /* Extract which lib and reason */
      lib = ERR_GET_LIB(errdetail);
      reason = ERR_GET_REASON(errdetail);

      if((lib == ERR_LIB_SSL) &&
         (reason == SSL_R_CERTIFICATE_VERIFY_FAILED)) {
        result = CURLE_SSL_CACERT;

        lerr = SSL_get_verify_result(BACKEND->handle);
        if(lerr != X509_V_OK) {
          *certverifyresult = lerr;
          snprintf(error_buffer, sizeof(error_buffer),
                   "SSL certificate problem: %s",
                   X509_verify_cert_error_string(lerr));
        }
        else
          /* strcpy() is fine here as long as the string fits within
             error_buffer */
          strcpy(error_buffer, "SSL certificate verification failed");
      }
      else {
        result = CURLE_SSL_CONNECT_ERROR;
        ossl_strerror(errdetail, error_buffer, sizeof(error_buffer));
      }

      /* detail is already set to the SSL error above */

      /* If we e.g. use SSLv2 request-method and the server doesn't like us
       * (RST connection etc.), OpenSSL gives no explanation whatsoever and
       * the SO_ERROR is also lost.
       */
      if(CURLE_SSL_CONNECT_ERROR == result && errdetail == 0) {
        const char * const hostname = SSL_IS_PROXY() ?
          conn->http_proxy.host.name : conn->host.name;
        const long int port = SSL_IS_PROXY() ? conn->port : conn->remote_port;
        failf(data, OSSL_PACKAGE " SSL_connect: %s in connection to %s:%ld ",
              SSL_ERROR_to_str(detail), hostname, port);
        return result;
      }

      /* Could be a CERT problem */
      failf(data, "%s", error_buffer);

      return result;
    }
  }
  else {
    /* we have been connected fine, we're not waiting for anything else. */
    connssl->connecting_state = ssl_connect_3;

    /* Informational message */
    infof(data, "SSL connection using %s / %s\n",
          get_ssl_version_txt(BACKEND->handle),
          SSL_get_cipher(BACKEND->handle));

#ifdef HAS_ALPN
    /* Sets data and len to negotiated protocol, len is 0 if no protocol was
     * negotiated
     */
    if(conn->bits.tls_enable_alpn) {
      const unsigned char *neg_protocol;
      unsigned int len;
      SSL_get0_alpn_selected(BACKEND->handle, &neg_protocol, &len);
      if(len != 0) {
        infof(data, "ALPN, server accepted to use %.*s\n", len, neg_protocol);

#ifdef USE_NGHTTP2
        if(len == NGHTTP2_PROTO_VERSION_ID_LEN &&
           !memcmp(NGHTTP2_PROTO_VERSION_ID, neg_protocol, len)) {
          conn->negnpn = CURL_HTTP_VERSION_2;
        }
        else
#endif
        if(len == ALPN_HTTP_1_1_LENGTH &&
           !memcmp(ALPN_HTTP_1_1, neg_protocol, ALPN_HTTP_1_1_LENGTH)) {
          conn->negnpn = CURL_HTTP_VERSION_1_1;
        }
      }
      else
        infof(data, "ALPN, server did not agree to a protocol\n");
    }
#endif

    return CURLE_OK;
  }
}